

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void runOptsUntilFixedPoint(Module *module)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ulong local_e0;
  FuncAttr funcAttr;
  
  funcAttr.globalVarUses._M_h._M_buckets = &funcAttr.globalVarUses._M_h._M_single_bucket;
  funcAttr.globalVarUses._M_h._M_bucket_count = 1;
  funcAttr.globalVarUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.globalVarUses._M_h._M_element_count = 0;
  funcAttr.globalVarUses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.globalVarUses._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.globalVarUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  funcAttr.globalVarDefs._M_h._M_buckets = &funcAttr.globalVarDefs._M_h._M_single_bucket;
  funcAttr.globalVarDefs._M_h._M_bucket_count = 1;
  funcAttr.globalVarDefs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.globalVarDefs._M_h._M_element_count = 0;
  funcAttr.globalVarDefs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.globalVarDefs._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.globalVarDefs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  funcAttr.pureFuncs._M_h._M_buckets = &funcAttr.pureFuncs._M_h._M_single_bucket;
  local_e0 = 1;
  funcAttr.pureFuncs._M_h._M_bucket_count = 1;
  funcAttr.pureFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.pureFuncs._M_h._M_element_count = 0;
  funcAttr.pureFuncs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.pureFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.pureFuncs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar22 = true;
  while (bVar22) {
    bVar1 = mocker::runOptPasses<mocker::RewriteBranches>(module);
    bVar2 = mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
    bVar3 = mocker::runOptPasses<mocker::MergeBlocks>(module);
    bVar4 = mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    mocker::runOptPasses<mocker::CopyPropagation>(module);
    mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
    mocker::runOptPasses<mocker::InductionVariable,mocker::FuncAttr&>(module,&funcAttr);
    if (local_e0 < 3) {
      mocker::runOptPasses<mocker::Reassociation>(module);
    }
    bVar5 = mocker::runOptPasses<mocker::GlobalValueNumbering>(module);
    bVar6 = mocker::runOptPasses<mocker::LocalValueNumbering>(module);
    bVar7 = mocker::runOptPasses<mocker::CopyPropagation>(module);
    bVar8 = mocker::runOptPasses<mocker::SparseSimpleConstantPropagation>(module);
    bVar9 = mocker::runOptPasses<mocker::CopyPropagation>(module);
    bVar10 = mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
    bVar11 = mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    bVar12 = mocker::runOptPasses<mocker::RewriteBranches>(module);
    bVar13 = mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
    bVar14 = mocker::runOptPasses<mocker::MergeBlocks>(module);
    bVar15 = mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
    bVar16 = mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    bVar17 = mocker::runOptPasses<mocker::RemoveTrivialBlocks>(module);
    bVar18 = mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
    bVar19 = mocker::runOptPasses<mocker::MergeBlocks>(module);
    bVar20 = mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
    bVar21 = mocker::runOptPasses<mocker::DeadCodeElimination,mocker::FuncAttr&>(module,&funcAttr);
    bVar22 = mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    bVar22 = (((((((bVar15 || bVar16) || bVar17) || bVar18) || bVar19) || bVar20) ||
              (((((bVar10 || bVar11) || bVar12) || bVar13) || bVar14) ||
              ((((bVar6 || bVar7) || bVar8) || bVar9) ||
              (((bVar3 || bVar4) || (bVar1 || bVar2)) || bVar5)))) || bVar21) || bVar22;
    local_e0 = local_e0 + 1;
    mocker::ir::verifyModule(module);
  }
  mocker::FuncAttr::~FuncAttr(&funcAttr);
  return;
}

Assistant:

void runOptsUntilFixedPoint(mocker::ir::Module &module) {
  using namespace mocker;
  std::size_t cnt = 0;

  FuncAttr funcAttr;
  bool optimizable = true;
  while (optimizable) {
    ++cnt;
    optimizable = false;

    optimizable |= runOptPasses<RewriteBranches>(module);
    optimizable |= runOptPasses<SimplifyPhiFunctions>(module);
    optimizable |= runOptPasses<MergeBlocks>(module);
    optimizable |= runOptPasses<RemoveUnreachableBlocks>(module);

    runOptPasses<CopyPropagation>(module);
    funcAttr.init(module);
    runOptPasses<InductionVariable>(module, funcAttr);
    if (cnt <= 2)
      runOptPasses<Reassociation>(module);
    optimizable |= runOptPasses<GlobalValueNumbering>(module);
    optimizable |= runOptPasses<LocalValueNumbering>(module);

    optimizable |= runOptPasses<CopyPropagation>(module);
    optimizable |= runOptPasses<SparseSimpleConstantPropagation>(module);
    optimizable |= runOptPasses<CopyPropagation>(module);
    optimizable |= runOptPasses<SimplifyPhiFunctions>(module);
    optimizable |= runOptPasses<RemoveUnreachableBlocks>(module);
    optimizable |= runOptPasses<RewriteBranches>(module);
    optimizable |= runOptPasses<SimplifyPhiFunctions>(module);
    optimizable |= runOptPasses<MergeBlocks>(module);
    optimizable |= runOptPasses<SimplifyPhiFunctions>(module);
    optimizable |= runOptPasses<RemoveUnreachableBlocks>(module);
    optimizable |= runOptPasses<RemoveTrivialBlocks>(module);
    optimizable |= runOptPasses<SimplifyPhiFunctions>(module);
    optimizable |= runOptPasses<MergeBlocks>(module);
    optimizable |= runOptPasses<RemoveUnreachableBlocks>(module);
    funcAttr.init(module);
    optimizable |= runOptPasses<DeadCodeElimination>(module, funcAttr);
    optimizable |= runOptPasses<RemoveUnreachableBlocks>(module);

    ir::verifyModule(module);
  }
}